

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPlatform.c
# Opt level: O2

char xplt_getch(void)

{
  int iVar1;
  
  system("/bin/stty raw");
  iVar1 = 0;
  while ((char)iVar1 == '\0') {
    iVar1 = getchar();
  }
  system("/bin/stty cooked");
  return (char)iVar1;
}

Assistant:

char xplt_getch() {
    char c = 0;
    system("/bin/stty raw");
    while (c == 0) {
        c = getchar();
    }
    system("/bin/stty cooked");
    return c;
}